

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH64_hash_t
XXH3_hashLong_64b_withSecret
          (void *input,size_t len,XXH64_hash_t seed64,xxh_u8 *secret,size_t secretLen)

{
  XXH64_hash_t XVar1;
  XXH3_f_accumulate_512 in_R9;
  xxh_u64 acc [8];
  
  XXH3_hashLong_internal_loop
            ((xxh_u64 *)&stack0xffffffffffffffa8,(xxh_u8 *)input,len,secret,secretLen,in_R9,
             (XXH3_f_scrambleAcc)0xc2b2ae3d);
  XVar1 = XXH3_mergeAccs((xxh_u64 *)&stack0xffffffffffffffa8,secret + 0xb,len * -0x61c8864e7a143579)
  ;
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t XXH3_hashLong_64b_withSecret(
    const void* XXH_RESTRICT input, size_t len, XXH64_hash_t seed64,
    const xxh_u8* XXH_RESTRICT secret, size_t secretLen) {
  (void)seed64;
  return XXH3_hashLong_64b_internal(input, len, secret, secretLen,
                                    XXH3_accumulate_512, XXH3_scrambleAcc);
}